

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O2

bool __thiscall GenericModel::removeRows(GenericModel *this,int row,int count,QModelIndex *parent)

{
  int iVar1;
  
  if ((-1 < row && 0 < count) &&
     (iVar1 = (**(code **)(*(long *)this + 0x78))(this,parent), count + row <= iVar1)) {
    QAbstractItemModel::beginRemoveRows((QModelIndex *)this,(int)parent,row);
    GenericModelPrivate::removeRows(this->m_dptr,row,count,parent);
    QAbstractItemModel::endRemoveRows();
    return true;
  }
  return false;
}

Assistant:

bool GenericModel::removeRows(int row, int count, const QModelIndex &parent)
{
    Q_ASSERT(!parent.isValid() || parent.model() == this);
    if (count <= 0 || row < 0 || row + count - 1 >= rowCount(parent))
        return false;
    beginRemoveRows(parent, row, row + count - 1);
    Q_D(GenericModel);
    d->removeRows(row, count, parent);
    endRemoveRows();
    return true;
}